

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * CreateSequence(ExpressionContext *ctx,SynBase *source,ExprBase *first,ExprBase *second)

{
  int iVar1;
  undefined4 extraout_var;
  ArrayView<ExprBase_*> arr;
  SmallArray<ExprBase_*,_2U> local_48;
  
  local_48.allocator = ctx->allocator;
  local_48.data = local_48.little;
  local_48.count = 2;
  local_48.max = 2;
  local_48.little[0] = first;
  local_48.little[1] = second;
  iVar1 = (*(local_48.allocator)->_vptr_Allocator[2])(local_48.allocator,0x68);
  arr.count = local_48.count;
  arr.data = local_48.data;
  arr._12_4_ = 0;
  ExprSequence::ExprSequence
            ((ExprSequence *)CONCAT44(extraout_var,iVar1),ctx->allocator,source,second->type,arr);
  SmallArray<ExprBase_*,_2U>::~SmallArray(&local_48);
  return &((ExprSequence *)CONCAT44(extraout_var,iVar1))->super_ExprBase;
}

Assistant:

ExprBase* CreateSequence(ExpressionContext &ctx, SynBase *source, ExprBase *first, ExprBase *second)
{
	SmallArray<ExprBase*, 2> expressions(ctx.allocator);

	expressions.push_back(first);
	expressions.push_back(second);

	return new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, source, second->type, expressions);
}